

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationCurveOccurrence::~IfcAnnotationCurveOccurrence
          (IfcAnnotationCurveOccurrence *this,void **vtt)

{
  void **vtt_local;
  IfcAnnotationCurveOccurrence *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationCurveOccurrence,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationCurveOccurrence,_0UL> *)
             &(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x80,vtt + 0x10);
  IfcAnnotationOccurrence::~IfcAnnotationOccurrence(&this->super_IfcAnnotationOccurrence,vtt + 1);
  return;
}

Assistant:

IfcAnnotationCurveOccurrence() : Object("IfcAnnotationCurveOccurrence") {}